

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_MeshCache::Internal_CopyHelper(ON_MeshCache *this,ON_MeshCacheItem *src_impl)

{
  ON_MeshCacheItem *pOVar1;
  ON_MeshCacheItem **ppOVar2;
  ON_MeshCache *this_00;
  ON_MeshCacheItem *pOVar3;
  
  this->m_impl = (ON_MeshCacheItem *)0x0;
  if (src_impl != (ON_MeshCacheItem *)0x0) {
    this_00 = this;
    pOVar3 = (ON_MeshCacheItem *)0x0;
    do {
      pOVar1 = Internal_CopyItem(this_00,src_impl);
      ppOVar2 = &pOVar3->m_next;
      if (pOVar3 == (ON_MeshCacheItem *)0x0) {
        ppOVar2 = &this->m_impl;
      }
      *ppOVar2 = pOVar1;
      src_impl = src_impl->m_next;
      pOVar3 = pOVar1;
    } while (src_impl != (ON_MeshCacheItem *)0x0);
  }
  return;
}

Assistant:

void ON_MeshCache::Internal_CopyHelper(
  const class ON_MeshCacheItem* src_impl
  )
{
  m_impl = 0;
  ON_MeshCacheItem* prev = nullptr;
  for (const ON_MeshCacheItem* src_item = src_impl; nullptr != src_item; src_item = src_item->m_next)
  {
    ON_MeshCacheItem* item_copy = Internal_CopyItem(*src_item);
    if (nullptr == prev)
      m_impl = item_copy;
    else
      prev->m_next = item_copy;
    prev = item_copy;
  }
}